

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolveAnalysis.cpp
# Opt level: O0

void __thiscall
HPresolveAnalysis::setup
          (HPresolveAnalysis *this,HighsLp *model_,HighsOptions *options_,HighsInt *numDeletedRows_,
          HighsInt *numDeletedCols_)

{
  HighsOptions *pHVar1;
  bool bVar2;
  undefined8 uVar3;
  HighsInt *in_RCX;
  HighsOptions *in_RDX;
  HighsLp *in_RSI;
  HPresolveAnalysis *in_RDI;
  HighsInt *in_R8;
  bool allow;
  HighsInt rule_type;
  HighsInt bit;
  size_type in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  byte bVar4;
  HighsLp *in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff40;
  undefined1 local_98 [84];
  HighsInt rule_type_00;
  uint local_34;
  uint local_30;
  
  in_RDI->model = in_RSI;
  in_RDI->options = in_RDX;
  in_RDI->numDeletedRows = in_RCX;
  in_RDI->numDeletedCols = in_R8;
  std::vector<bool,_std::allocator<bool>_>::assign
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18
             ,(bool *)0x743b89);
  if ((in_RDI->options->super_HighsOptionsStruct).presolve_rule_off != 0) {
    highsLogUser(&(in_RDI->options->super_HighsOptionsStruct).log_options,kInfo,
                 "Presolve rules not allowed:\n");
    local_30 = 1;
    for (local_34 = 0; (int)local_34 < 0xe; local_34 = local_34 + 1) {
      bVar2 = (bool)((((in_RDI->options->super_HighsOptionsStruct).presolve_rule_off & local_30) !=
                      0 ^ 0xffU) & 1);
      if ((int)local_34 < 6) {
        if (bVar2 == false) {
          pHVar1 = in_RDI->options;
          in_stack_ffffffffffffff28 = (HighsLp *)local_98;
          in_stack_ffffffffffffff38 = local_34;
          in_stack_ffffffffffffff3c = local_30;
          utilPresolveRuleTypeToString_abi_cxx11_(rule_type_00);
          uVar3 = std::__cxx11::string::c_str();
          highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kWarning,
                       "Cannot disallow rule %2d (bit %4d): %s\n",(ulong)in_stack_ffffffffffffff38,
                       (ulong)in_stack_ffffffffffffff3c,uVar3);
          std::__cxx11::string::~string((string *)local_98);
        }
      }
      else {
        join_0x00000010_0x00000000_ =
             std::vector<bool,_std::allocator<bool>_>::operator[]
                       (in_stack_ffffffffffffff40,
                        CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
        std::_Bit_reference::operator=((_Bit_reference *)(local_98 + 0x50),bVar2);
        if (bVar2 == false) {
          pHVar1 = in_RDI->options;
          in_stack_ffffffffffffff40 = (vector<bool,_std::allocator<bool>_> *)(local_98 + 0x30);
          utilPresolveRuleTypeToString_abi_cxx11_(rule_type_00);
          uVar3 = std::__cxx11::string::c_str();
          highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,
                       "   Rule %2d (bit %4d): %s\n",(ulong)local_34,(ulong)local_30,uVar3);
          std::__cxx11::string::~string((string *)(local_98 + 0x30));
        }
      }
      local_30 = local_30 << 1;
    }
  }
  bVar4 = 0;
  if (((in_RDX->super_HighsOptionsStruct).presolve_rule_logging & 1U) != 0) {
    bVar2 = HighsLp::isMip(in_stack_ffffffffffffff28);
    bVar4 = bVar2 ^ 0xff;
  }
  in_RDI->allow_logging_ = (bool)(bVar4 & 1);
  in_RDI->logging_on_ = (bool)(in_RDI->allow_logging_ & 1);
  in_RDI->log_rule_type_ = -1;
  resetNumDeleted(in_RDI);
  HighsPresolveLog::clear((HighsPresolveLog *)CONCAT17(bVar4,in_stack_ffffffffffffff20));
  in_RDI->original_num_col_ = in_RDI->model->num_col_;
  in_RDI->original_num_row_ = in_RDI->model->num_row_;
  return;
}

Assistant:

void HPresolveAnalysis::setup(const HighsLp* model_,
                              const HighsOptions* options_,
                              const HighsInt& numDeletedRows_,
                              const HighsInt& numDeletedCols_) {
  model = model_;
  options = options_;
  numDeletedRows = &numDeletedRows_;
  numDeletedCols = &numDeletedCols_;

  this->allow_rule_.assign(kPresolveRuleCount, true);

  if (options->presolve_rule_off) {
    // Some presolve rules are off
    //
    // Transform options->presolve_rule_off into logical settings in
    // allow_rule_[*], commenting on the rules switched off
    highsLogUser(options->log_options, HighsLogType::kInfo,
                 "Presolve rules not allowed:\n");
    HighsInt bit = 1;
    for (HighsInt rule_type = kPresolveRuleMin; rule_type < kPresolveRuleCount;
         rule_type++) {
      // Identify whether this rule is allowed
      const bool allow = !(options->presolve_rule_off & bit);
      if (rule_type >= kPresolveRuleFirstAllowOff) {
        // This is a rule that can be switched off, so comment
        // positively if it is off
        allow_rule_[rule_type] = allow;
        if (!allow)
          highsLogUser(options->log_options, HighsLogType::kInfo,
                       "   Rule %2d (bit %4d): %s\n", (int)rule_type, (int)bit,
                       utilPresolveRuleTypeToString(rule_type).c_str());
      } else if (!allow) {
        // This is a rule that cannot be switched off so, if an
        // attempt is made, don't allow it to be off and comment
        // negatively
        highsLogUser(options->log_options, HighsLogType::kWarning,
                     "Cannot disallow rule %2d (bit %4d): %s\n", (int)rule_type,
                     (int)bit, utilPresolveRuleTypeToString(rule_type).c_str());
      }
      bit *= 2;
    }
  }
  // Allow logging if option is set and model is not a MIP
  allow_logging_ = options_->presolve_rule_logging && !model_->isMip();
  logging_on_ = allow_logging_;
  log_rule_type_ = kPresolveRuleIllegal;
  resetNumDeleted();
  presolve_log_.clear();
  original_num_col_ = model->num_col_;
  original_num_row_ = model->num_row_;
}